

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_classes.h
# Opt level: O3

archive * cppcms::operator&(archive *a,unique_ptr<int,_std::default_delete<int>_> *object)

{
  int iVar1;
  
  iVar1 = cppcms::archive::mode();
  if (iVar1 == 0) {
    archive_traits<std::unique_ptr<int,_std::default_delete<int>_>,_void>::save(object,a);
  }
  else {
    archive_traits<std::unique_ptr<int,_std::default_delete<int>_>,_void>::load(object,a);
  }
  return a;
}

Assistant:

archive & operator &(archive &a,Archivable &object)
	{
		if(a.mode() == archive::save_to_archive)
			archive_traits<Archivable>::save(object,a);
		else
			archive_traits<Archivable>::load(object,a);
		return a;
	}